

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

void ZSTD_insertDUBT1(ZSTD_matchState_t *ms,U32 curr,BYTE *inputEnd,U32 nbCompares,U32 btLow,
                     ZSTD_dictMode_e dictMode)

{
  uint uVar1;
  U32 *pUVar2;
  size_t sVar3;
  BYTE *local_100;
  BYTE *local_f8;
  uint local_ec;
  BYTE *local_e8;
  BYTE *local_e0;
  BYTE *mBase;
  size_t matchLength;
  U32 *nextPtr;
  U32 windowLow;
  U32 maxDistance;
  U32 windowValid;
  U32 dummy32;
  U32 matchIndex;
  U32 *largerPtr;
  U32 *smallerPtr;
  BYTE *match;
  BYTE *prefixStart;
  BYTE *dictEnd;
  BYTE *iend;
  BYTE *ip;
  BYTE *pBStack_68;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  ZSTD_compressionParameters *cParams;
  U32 local_28;
  ZSTD_dictMode_e dictMode_local;
  U32 btLow_local;
  U32 nbCompares_local;
  BYTE *inputEnd_local;
  ZSTD_matchState_t *pZStack_10;
  U32 curr_local;
  ZSTD_matchState_t *ms_local;
  
  bt = &(ms->cParams).windowLog;
  _btMask = ms->chainTable;
  commonLengthSmaller._4_4_ = (ms->cParams).chainLog - 1;
  commonLengthSmaller._0_4_ = (1 << ((byte)commonLengthSmaller._4_4_ & 0x1f)) - 1;
  commonLengthLarger = 0;
  base = (BYTE *)0x0;
  dictBase = (ms->window).base;
  pBStack_68 = (ms->window).dictBase;
  ip._4_4_ = (ms->window).dictLimit;
  if (curr < ip._4_4_) {
    local_e0 = pBStack_68 + curr;
  }
  else {
    local_e0 = dictBase + curr;
  }
  iend = local_e0;
  local_e8 = inputEnd;
  if (curr < ip._4_4_) {
    local_e8 = pBStack_68 + ip._4_4_;
  }
  dictEnd = local_e8;
  prefixStart = pBStack_68 + ip._4_4_;
  match = dictBase + ip._4_4_;
  largerPtr = _btMask + ((curr & (uint)commonLengthSmaller) << 1);
  windowValid = *largerPtr;
  local_ec = (ms->window).lowLimit;
  uVar1 = 1 << ((byte)((ZSTD_compressionParameters *)bt)->windowLog & 0x1f);
  _dummy32 = largerPtr + 1;
  cParams._4_4_ = dictMode;
  local_28 = btLow;
  dictMode_local = nbCompares;
  _btLow_local = inputEnd;
  inputEnd_local._4_4_ = curr;
  pZStack_10 = ms;
  if (uVar1 < curr - local_ec) {
    local_ec = curr - uVar1;
  }
LAB_00c3a0d8:
  do {
    if (dictMode_local == ZSTD_noDict || windowValid <= local_ec) {
LAB_00c3a379:
      *_dummy32 = 0;
      *largerPtr = 0;
      return;
    }
    pUVar2 = _btMask + ((windowValid & (uint)commonLengthSmaller) << 1);
    if (commonLengthLarger < base) {
      local_f8 = (BYTE *)commonLengthLarger;
    }
    else {
      local_f8 = base;
    }
    if (((cParams._4_4_ == ZSTD_extDict) && (local_f8 + windowValid < (BYTE *)(ulong)ip._4_4_)) &&
       (ip._4_4_ <= inputEnd_local._4_4_)) {
      smallerPtr = (U32 *)(pBStack_68 + windowValid);
      dictMode_local = dictMode_local - ZSTD_extDict;
      sVar3 = ZSTD_count_2segments
                        (iend + (long)local_f8,(BYTE *)((long)smallerPtr + (long)local_f8),dictEnd,
                         prefixStart,match);
      mBase = local_f8 + sVar3;
      if ((BYTE *)(ulong)ip._4_4_ <= mBase + windowValid) {
        smallerPtr = (U32 *)(dictBase + windowValid);
      }
    }
    else {
      if ((cParams._4_4_ == ZSTD_extDict) && (local_f8 + windowValid < (BYTE *)(ulong)ip._4_4_)) {
        local_100 = pBStack_68;
      }
      else {
        local_100 = dictBase;
      }
      smallerPtr = (U32 *)(local_100 + windowValid);
      dictMode_local = dictMode_local - ZSTD_extDict;
      sVar3 = ZSTD_count(iend + (long)local_f8,(BYTE *)((long)smallerPtr + (long)local_f8),dictEnd);
      mBase = local_f8 + sVar3;
    }
    if (iend + (long)mBase == dictEnd) goto LAB_00c3a379;
    if (iend[(long)mBase] <= *(byte *)((long)smallerPtr + (long)mBase)) {
      *_dummy32 = windowValid;
      base = mBase;
      if (windowValid <= local_28) {
        _dummy32 = &maxDistance;
        goto LAB_00c3a379;
      }
      windowValid = *pUVar2;
      _dummy32 = pUVar2;
      goto LAB_00c3a0d8;
    }
    *largerPtr = windowValid;
    commonLengthLarger = (size_t)mBase;
    if (windowValid <= local_28) {
      largerPtr = &maxDistance;
      goto LAB_00c3a379;
    }
    largerPtr = pUVar2 + 1;
    windowValid = pUVar2[1];
  } while( true );
}

Assistant:

static void
ZSTD_insertDUBT1(ZSTD_matchState_t* ms,
                 U32 curr, const BYTE* inputEnd,
                 U32 nbCompares, U32 btLow,
                 const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const ip = (curr>=dictLimit) ? base + curr : dictBase + curr;
    const BYTE* const iend = (curr>=dictLimit) ? inputEnd : dictBase + dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 matchIndex = *smallerPtr;   /* this candidate is unsorted : next sorted candidate is reached through *smallerPtr, while *largerPtr contains previous unsorted candidate (which is already saved and can be overwritten) */
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowValid = ms->window.lowLimit;
    U32 const maxDistance = 1U << cParams->windowLog;
    U32 const windowLow = (curr - windowValid > maxDistance) ? curr - maxDistance : windowValid;


    DEBUGLOG(8, "ZSTD_insertDUBT1(%u) (dictLimit=%u, lowLimit=%u)",
                curr, dictLimit, windowLow);
    assert(curr >= btLow);
    assert(ip < iend);   /* condition for ZSTD_count */

    while (nbCompares-- && (matchIndex > windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);
        /* note : all candidates are now supposed sorted,
         * but it's still possible to have nextPtr[1] == ZSTD_DUBT_UNSORTED_MARK
         * when a real index has the same value as ZSTD_DUBT_UNSORTED_MARK */

        if ( (dictMode != ZSTD_extDict)
          || (matchIndex+matchLength >= dictLimit)  /* both in current segment*/
          || (curr < dictLimit) /* both in extDict */) {
            const BYTE* const mBase = ( (dictMode != ZSTD_extDict)
                                     || (matchIndex+matchLength >= dictLimit)) ?
                                        base : dictBase;
            assert( (matchIndex+matchLength >= dictLimit)   /* might be wrong if extDict is incorrectly set to 0 */
                 || (curr < dictLimit) );
            match = mBase + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* preparation for next read of match[matchLength] */
        }

        DEBUGLOG(8, "ZSTD_insertDUBT1: comparing %u with %u : found %u common bytes ",
                    curr, matchIndex, (U32)matchLength);

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            DEBUGLOG(8, "ZSTD_insertDUBT1: %u (>btLow=%u) is smaller : next => %u",
                        matchIndex, btLow, nextPtr[1]);
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            DEBUGLOG(8, "ZSTD_insertDUBT1: %u (>btLow=%u) is larger => %u",
                        matchIndex, btLow, nextPtr[0]);
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
}